

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.h
# Opt level: O2

Box * __thiscall libDAI::Box::operator*=(Box *this,Box *c)

{
  TProb<double>::operator*=(&this->_min,&c->_min);
  TProb<double>::operator*=(&this->_max,&c->_max);
  return this;
}

Assistant:

Box& operator*= (const Box &c) {
//#ifdef DEBUG
                assert( _min <= _max );
                assert( c._min <= c._max );
//#endif
                assert( _vars == c._vars );
                _min *= c._min;
                _max *= c._max;
                return *this;
            }